

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemExtensionManager.cpp
# Opt level: O0

BuildSystemExtension * __thiscall
llbuild::buildsystem::BuildSystemExtensionManager::lookupByCommandPath
          (BuildSystemExtensionManager *this,StringRef path)

{
  ProcessAttributes attr_00;
  initializer_list<llvm::StringRef> __l;
  bool bVar1;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>
  *pSVar2;
  unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
  *puVar3;
  char *path_00;
  byte local_ce9;
  unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
  local_c88;
  pointer local_c80;
  BuildSystemExtension *extension;
  _func_BuildSystemExtension_ptr *registrationFn;
  Handle handle;
  undefined1 local_c50 [8];
  SmallString<1024U> extensionPath;
  POSIXEnvironment local_820;
  ArrayRef<llvm::StringRef> local_7b0;
  ProcessHandle local_7a0;
  anon_class_1_0_00000001 local_791;
  undefined1 local_790 [8];
  ProcessCompletionFn completionFn;
  undefined1 local_768 [8];
  ProcessReleaseFn releaseFn;
  StringRef local_740;
  char *local_730;
  size_t local_728;
  char *local_720;
  size_t local_718;
  char *local_710;
  size_t local_708;
  iterator local_700;
  size_type local_6f8;
  undefined1 local_6f0 [8];
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> cmd;
  ProcessHandle handle_1;
  ProcessGroup pgrp;
  ProcessAttributes attr;
  CapturingProcessDelegate delegate;
  StringRef local_1e0;
  undefined1 local_1c0 [8];
  SmallString<256U> infoPath;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
  local_98;
  char *local_90;
  size_t local_88;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_>
  local_80;
  iterator it;
  lock_guard<std::mutex> guard;
  BuildSystemExtensionManager *this_local;
  StringRef path_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&this->extensionsLock);
  local_90 = path.Data;
  local_88 = path.Length;
  local_80.Ptr = (StringMapEntryBase **)
                 llvm::
                 StringMap<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>,_llvm::MallocAllocator>
                 ::find(&this->extensions,path);
  local_98.Ptr = (StringMapEntryBase **)
                 llvm::
                 StringMap<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>,_llvm::MallocAllocator>
                 ::end(&this->extensions);
  bVar1 = llvm::
          iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_&>
          ::operator!=((iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_&>
                        *)&local_80,
                       (StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>
                        *)&local_98);
  if (bVar1) {
    pSVar2 = llvm::
             iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_&>
             ::operator->((iterator_facade_base<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_std::forward_iterator_tag,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>,_long,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_*,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>_>_&>
                           *)&local_80);
    path_local.Length =
         (size_t)std::
                 unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
                 ::get(&pSVar2->second);
  }
  else {
    infoPath.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
         path.Data;
    puVar3 = llvm::
             StringMap<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>,_llvm::MallocAllocator>
             ::operator[](&this->extensions,path);
    std::
    unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
    ::operator=(puVar3,(nullptr_t)0x0);
    llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_1c0,path);
    strlen("-for-llbuild");
    llvm::SmallString<256U>::operator+=((SmallString<256U> *)local_1c0,local_1e0);
    llvm::Twine::Twine((Twine *)&delegate.success,(SmallVectorImpl<char> *)local_1c0);
    bVar1 = llvm::sys::fs::exists((Twine *)&delegate.success);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      lookupByCommandPath::CapturingProcessDelegate::CapturingProcessDelegate
                ((CapturingProcessDelegate *)&attr.inheritEnvironment);
      memset(&attr,0,0x10);
      llvm::StringRef::StringRef((StringRef *)&attr);
      attr.workingDir.Length._0_1_ = 1;
      attr.workingDir.Length._1_1_ = 1;
      llbuild::basic::ProcessGroup::ProcessGroup((ProcessGroup *)&handle_1);
      memset(&cmd.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0,8);
      local_740 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_1c0);
      local_730 = "--llbuild-extension-version";
      local_728 = strlen("--llbuild-extension-version");
      local_720 = "0";
      local_718 = strlen("0");
      local_710 = "--extension-path";
      local_708 = strlen("--extension-path");
      local_700 = &local_740;
      local_6f8 = 4;
      std::allocator<llvm::StringRef>::allocator
                ((allocator<llvm::StringRef> *)((long)&releaseFn._M_invoker + 7));
      __l._M_len = local_6f8;
      __l._M_array = local_700;
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::vector
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_6f0,__l,
                 (allocator_type *)((long)&releaseFn._M_invoker + 7));
      std::allocator<llvm::StringRef>::~allocator
                ((allocator<llvm::StringRef> *)((long)&releaseFn._M_invoker + 7));
      std::function<void(std::function<void()>&&)>::
      function<llbuild::buildsystem::BuildSystemExtensionManager::lookupByCommandPath(llvm::StringRef)::__0,void>
                ((function<void(std::function<void()>&&)> *)local_768,
                 (anon_class_1_0_00000001 *)((long)&completionFn._M_invoker + 7));
      std::function<void(llbuild::basic::ProcessResult)>::
      function<llbuild::buildsystem::BuildSystemExtensionManager::lookupByCommandPath(llvm::StringRef)::__1,void>
                ((function<void(llbuild::basic::ProcessResult)> *)local_790,&local_791);
      local_7a0.id = (uint64_t)
                     cmd.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
      llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>
                (&local_7b0,(vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_6f0);
      llbuild::basic::POSIXEnvironment::POSIXEnvironment(&local_820);
      extensionPath.super_SmallVector<char,_1024U>.super_SmallVectorStorage<char,_1024U>.InlineElts.
      _1018_6_ = pgrp.mutex.super___mutex_base._M_mutex._34_6_;
      extensionPath.super_SmallVector<char,_1024U>.super_SmallVectorStorage<char,_1024U>.InlineElts.
      _1016_2_ = 1;
      attr_00.controlEnabled = (bool)attr.workingDir.Length._1_1_;
      attr_00.inheritEnvironment = (bool)(undefined1)attr.workingDir.Length;
      attr_00._26_6_ = attr.workingDir.Length._2_6_;
      attr_00.workingDir.Data = (char *)attr._0_8_;
      attr_00.canSafelyInterrupt = (bool)SUB21(1,0);
      attr_00.connectToConsole = (bool)SUB21(1 >> 8,0);
      attr_00._2_1_ = (char  [1])SUB61(pgrp.mutex.super___mutex_base._M_mutex._34_6_,0);
      attr_00._3_1_ = (char  [1])SUB61((uint6)pgrp.mutex.super___mutex_base._M_mutex._34_6_ >> 8,0);
      attr_00._4_1_ =
           (char  [1])SUB61((uint6)pgrp.mutex.super___mutex_base._M_mutex._34_6_ >> 0x10,0);
      attr_00._5_1_ =
           (char  [1])SUB61((uint6)pgrp.mutex.super___mutex_base._M_mutex._34_6_ >> 0x18,0);
      attr_00._6_1_ =
           (char  [1])SUB61((uint6)pgrp.mutex.super___mutex_base._M_mutex._34_6_ >> 0x20,0);
      attr_00._7_1_ =
           (char  [1])SUB61((uint6)pgrp.mutex.super___mutex_base._M_mutex._34_6_ >> 0x28,0);
      attr_00.workingDir.Length = (size_t)attr.workingDir.Data;
      llbuild::basic::spawnProcess
                ((ProcessDelegate *)&attr.inheritEnvironment,(ProcessContext *)0x0,
                 (ProcessGroup *)&handle_1,local_7a0,local_7b0,&local_820,attr_00,
                 (ProcessReleaseFn *)local_768,(ProcessCompletionFn *)local_790);
      llbuild::basic::POSIXEnvironment::~POSIXEnvironment(&local_820);
      std::function<void_(llbuild::basic::ProcessResult)>::~function
                ((function<void_(llbuild::basic::ProcessResult)> *)local_790);
      std::function<void_(std::function<void_()>_&&)>::~function
                ((function<void_(std::function<void_()>_&&)> *)local_768);
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)local_6f0);
      llbuild::basic::ProcessGroup::~ProcessGroup((ProcessGroup *)&handle_1);
      llvm::SmallString<1024U>::SmallString
                ((SmallString<1024U> *)local_c50,(SmallString<1024U> *)&delegate);
      local_ce9 = 1;
      if (((byte)delegate.output.super_SmallVector<char,_1024U>.
                 super_SmallVectorStorage<char,_1024U>.InlineElts[0x3f8].
                 super_AlignedCharArray<1UL,_1UL>.buffer[0] & 1) != 0) {
        llvm::Twine::Twine((Twine *)&handle,(SmallVectorImpl<char> *)local_1c0);
        bVar1 = llvm::sys::fs::exists((Twine *)&handle);
        local_ce9 = bVar1 ^ 0xff;
      }
      if ((local_ce9 & 1) == 0) {
        path_00 = llvm::SmallString<1024U>::c_str((SmallString<1024U> *)local_c50);
        registrationFn = (_func_BuildSystemExtension_ptr *)llbuild::basic::sys::OpenLibrary(path_00)
        ;
        if (registrationFn == (_func_BuildSystemExtension_ptr *)0x0) {
          path_local.Length = 0;
        }
        else {
          extension = (BuildSystemExtension *)
                      llbuild::basic::sys::GetSymbolByname
                                (registrationFn,"initialize_llbuild_buildsystem_extension_v0");
          if (extension == (BuildSystemExtension *)0x0) {
            llbuild::basic::sys::CloseLibrary(registrationFn);
            path_local.Length = 0;
          }
          else {
            local_c80 = (pointer)(*(code *)extension)();
            if (local_c80 == (pointer)0x0) {
              llbuild::basic::sys::CloseLibrary(registrationFn);
              path_local.Length = 0;
            }
            else {
              std::
              unique_ptr<llbuild::buildsystem::BuildSystemExtension,std::default_delete<llbuild::buildsystem::BuildSystemExtension>>
              ::unique_ptr<std::default_delete<llbuild::buildsystem::BuildSystemExtension>,void>
                        ((unique_ptr<llbuild::buildsystem::BuildSystemExtension,std::default_delete<llbuild::buildsystem::BuildSystemExtension>>
                          *)&local_c88,local_c80);
              puVar3 = llvm::
                       StringMap<std::unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>,_llvm::MallocAllocator>
                       ::operator[](&this->extensions,path);
              std::
              unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
              ::operator=(puVar3,&local_c88);
              std::
              unique_ptr<llbuild::buildsystem::BuildSystemExtension,_std::default_delete<llbuild::buildsystem::BuildSystemExtension>_>
              ::~unique_ptr(&local_c88);
              path_local.Length = (size_t)local_c80;
            }
          }
        }
      }
      else {
        path_local.Length = 0;
      }
      llvm::SmallString<1024U>::~SmallString((SmallString<1024U> *)local_c50);
      lookupByCommandPath::CapturingProcessDelegate::~CapturingProcessDelegate
                ((CapturingProcessDelegate *)&attr.inheritEnvironment);
    }
    else {
      path_local.Length = 0;
    }
    llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_1c0);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return (BuildSystemExtension *)path_local.Length;
}

Assistant:

BuildSystemExtension*
BuildSystemExtensionManager::lookupByCommandPath(StringRef path) {
  std::lock_guard<std::mutex> guard(extensionsLock);

  // Check the cache.
  auto it = extensions.find(path);
  if (it != extensions.end()) return it->second.get();

  // Register negative hit, unless we succeed.
  extensions[path] = nullptr;

  // If missing, look for an extension for this path.
  //
  // Currently, extensions are discovered by expecting that a command has an
  // adjacent "...-for-llbuild" binary which can be queried for info.
  SmallString<256> infoPath{ path };
  infoPath += "-for-llbuild";
  if (!llvm::sys::fs::exists(infoPath)) {
    return {};
  }

  // If the path exists, then query it to find the actual extension library.
  struct CapturingProcessDelegate: ProcessDelegate {
    SmallString<1024> output;
    bool success;
    
    virtual void processStarted(ProcessContext* ctx, ProcessHandle handle,
                                llbuild_pid_t pid) {}

    virtual void processHadError(ProcessContext* ctx, ProcessHandle handle,
                                 const Twine& message) {};

    virtual void processHadOutput(ProcessContext* ctx, ProcessHandle handle,
                                  StringRef data) {
      output += data;
    };

    virtual void processFinished(ProcessContext* ctx, ProcessHandle handle,
                                 const ProcessResult& result) {
      success = (result.status == ProcessStatus::Succeeded &&
                 result.exitCode == 0);
    }
  };
  CapturingProcessDelegate delegate;
  {
    // FIXME: Add a utility for capturing a subprocess infocation.
    ProcessAttributes attr{/*canSafelyInterrupt=*/true};
    ProcessGroup pgrp;
    ProcessHandle handle{0};
    std::vector<StringRef> cmd{infoPath, "--llbuild-extension-version", "0",
        "--extension-path" };
    ProcessReleaseFn releaseFn = [](std::function<void()>&& pwait){ pwait(); };
    ProcessCompletionFn completionFn = [](ProcessResult){};
    spawnProcess(delegate, nullptr, pgrp, handle, cmd, POSIXEnvironment(), attr,
                 std::move(releaseFn), std::move(completionFn));
  }

  // The output is expected to be the exact path to the extension (no extra
  // whitespace, etc.).
  auto extensionPath = delegate.output;
  if (!delegate.success || !llvm::sys::fs::exists(infoPath)) {
    return {};
  }

  // Load the plugin.
  auto handle = sys::OpenLibrary(extensionPath.c_str());
  if (handle == nullptr)
    return {};

  BuildSystemExtension *(*registrationFn)(void) =
      reinterpret_cast<decltype(registrationFn)>(sys::GetSymbolByname(handle,
                                                                      "initialize_llbuild_buildsystem_extension_v0"));
  if (!registrationFn) {
    sys::CloseLibrary(handle);
    return {};
  }

  // For now, we expect the registration to simply allocate and return us a (C)
  // extension instance.
  //
  // FIXME: This needs to be reworked to go through a C API.
  auto *extension = registrationFn();
  if (!extension) {
    sys::CloseLibrary(handle);
    return {};
  }

  extensions[path] = std::unique_ptr<BuildSystemExtension>(extension);
  return extension;
}